

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::encryption_handler::encrypt(encryption_handler *this,char *__block,int __edflag)

{
  _func_int *p_Var1;
  undefined1 auVar2 [16];
  element_type *peVar3;
  encryption_handler *__return_storage_ptr__;
  list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  *plVar4;
  bool bVar5;
  reference pvVar6;
  index_type iVar7;
  ulong uVar8;
  span<char> *psVar9;
  char *p;
  span<char> *psVar10;
  size_type sVar11;
  span<char> *in_RCX;
  undefined4 in_register_00000014;
  long lVar12;
  span<char> *p_00;
  span<libtorrent::span<char>_> sVar13;
  undefined8 uStack_1f0;
  span<char> sStack_1e8;
  element_type *local_1d8;
  span<char> *local_1d0;
  encryption_handler *local_1c8;
  span<char> *local_1c0;
  span<char> *local_1b8;
  span<char> *local_1b0;
  span<char> *local_1a8;
  span<char> *local_1a0;
  long local_198;
  bool local_189;
  span<char> *local_188;
  span<char> *local_180;
  span<char> *local_178;
  span<char> *local_170;
  unsigned_long local_168;
  span<char> *local_160;
  encryption_handler *local_158;
  encryption_handler *local_150;
  list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
  *local_148;
  undefined1 local_140 [8];
  span<char> buf;
  span<char> *__end3;
  span<char> *__begin3;
  span<libtorrent::span<char>_> *__range3;
  undefined8 local_108;
  undefined8 local_100;
  tuple<int,_libtorrent::span<libtorrent::span<const_char>_>_> local_f8;
  undefined1 local_e0 [8];
  span<libtorrent::span<const_char>_> out_iovec;
  int next_barrier;
  int local_a0;
  int size;
  int i;
  int num_bufs;
  alloca_destructor<libtorrent::span<char>_> abufs_destructor;
  span<char> *local_80;
  span<char> *TORRENT_ALLOCA_tmp;
  span<char> *local_68;
  long local_60;
  long TORRENT_ALLOCA_size;
  span<libtorrent::span<char>_> abufs;
  undefined1 auStack_40 [7];
  bool need_destruct;
  span<libtorrent::span<char>_> bufs;
  int to_process;
  encryption_handler *this_local;
  span<libtorrent::span<char>_> iovec_local;
  
  this_local = (encryption_handler *)CONCAT44(in_register_00000014,__edflag);
  p_00 = &sStack_1e8;
  uStack_1f0 = 0x7cf309;
  local_158 = this;
  local_150 = this;
  local_148 = (list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
               *)__block;
  iovec_local.m_ptr = in_RCX;
  iovec_local.m_len = (difference_type)this;
  pvVar6 = ::std::__cxx11::
           list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
           ::front((list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
                    *)__block);
  bufs.m_len._4_4_ = pvVar6->next;
  uStack_1f0 = 0x7cf318;
  span<libtorrent::span<char>_>::span((span<libtorrent::span<char>_> *)auStack_40);
  abufs.m_len._7_1_ = 0;
  if (bufs.m_len._4_4_ == 0x7fffffff) {
    _auStack_40 = this_local;
    bufs.m_ptr = iovec_local.m_ptr;
  }
  else {
    uStack_1f0 = 0x7cf332;
    span<libtorrent::span<char>_>::span((span<libtorrent::span<char>_> *)&TORRENT_ALLOCA_size);
    uStack_1f0 = 0x7cf33b;
    iVar7 = span<libtorrent::span<char>_>::size((span<libtorrent::span<char>_> *)&this_local);
    uStack_1f0 = 0x7cf343;
    local_60 = numeric_cast<long,long,void>(iVar7);
    if (local_60 < 0x101) {
      uStack_1f0 = 0x7cf42b;
      iVar7 = span<libtorrent::span<char>_>::size((span<libtorrent::span<char>_> *)&this_local);
      p_00 = &sStack_1e8;
      if (0 < iVar7) {
        uStack_1f0 = 0x7cf43a;
        iVar7 = span<libtorrent::span<char>_>::size((span<libtorrent::span<char>_> *)&this_local);
        lVar12 = local_60;
        p_00 = &sStack_1e8 + -iVar7;
        (&uStack_1f0)[iVar7 * -2] = 0x7cf45f;
        span<libtorrent::span<char>_>::span
                  ((span<libtorrent::span<char>_> *)&abufs_destructor.objects.m_len,p_00,lVar12);
        TORRENT_ALLOCA_size = abufs_destructor.objects.m_len;
        abufs.m_ptr = local_80;
        (&uStack_1f0)[iVar7 * -2] = 0x7cf478;
        local_188 = span<libtorrent::span<char>_>::begin
                              ((span<libtorrent::span<char>_> *)&TORRENT_ALLOCA_size);
        (&uStack_1f0)[iVar7 * -2] = 0x7cf488;
        psVar10 = span<libtorrent::span<char>_>::end
                            ((span<libtorrent::span<char>_> *)&TORRENT_ALLOCA_size);
        psVar9 = local_188;
        (&uStack_1f0)[iVar7 * -2] = 0x7cf497;
        uninitialized_default_construct<libtorrent::span<char>*>(psVar9,psVar10);
      }
    }
    else {
      uStack_1f0 = 0x7cf35e;
      iVar7 = span<libtorrent::span<char>_>::size((span<libtorrent::span<char>_> *)&this_local);
      uStack_1f0 = 0x7cf366;
      local_168 = numeric_cast<unsigned_long,long,void>(iVar7);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_168;
      uVar8 = SUB168(auVar2 * ZEXT816(0x10),0);
      if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      uStack_1f0 = 0x7cf38e;
      local_160 = (span<char> *)operator_new__(uVar8);
      if (local_168 != 0) {
        local_178 = local_160 + local_168;
        local_170 = local_160;
        do {
          local_180 = local_170;
          uStack_1f0 = 0x7cf3de;
          span<char>::span(local_170);
          local_170 = local_180 + 1;
        } while (local_170 != local_178);
      }
      uStack_1f0 = 0x7cf410;
      span<libtorrent::span<char>_>::span
                ((span<libtorrent::span<char>_> *)&TORRENT_ALLOCA_tmp,local_160,local_60);
      TORRENT_ALLOCA_size = (long)TORRENT_ALLOCA_tmp;
      abufs.m_ptr = local_68;
      p_00 = &sStack_1e8;
    }
    p_00[-1].m_len = 0x7cf4a9;
    span<libtorrent::span<char>>::
    span<libtorrent::span<libtorrent::span<char>>,libtorrent::span<char>,void>
              ((span<libtorrent::span<char>> *)&i,
               (span<libtorrent::span<char>_> *)&TORRENT_ALLOCA_size);
    _auStack_40 = (encryption_handler *)TORRENT_ALLOCA_size;
    bufs.m_ptr = abufs.m_ptr;
    abufs.m_len._7_1_ = 1;
    size = 0;
    local_a0 = 0;
    while( true ) {
      local_189 = false;
      if (0 < bufs.m_len._4_4_) {
        local_198 = (long)local_a0;
        p_00[-1].m_len = 0x7cf4f6;
        iVar7 = span<libtorrent::span<char>_>::size((span<libtorrent::span<char>_> *)&this_local);
        local_189 = local_198 < iVar7;
      }
      if (local_189 == false) break;
      size = size + 1;
      p_00[-1].m_len = 0x7cf539;
      psVar9 = span<libtorrent::span<char>_>::operator[]
                         ((span<libtorrent::span<char>_> *)&this_local,(long)local_a0);
      local_1a0 = psVar9;
      p_00[-1].m_len = 0x7cf54e;
      iVar7 = span<char>::size(psVar9);
      if (bufs.m_len._4_4_ < (int)iVar7) {
        p_00[-1].m_len = 0x7cf56f;
        local_1a8 = span<libtorrent::span<char>_>::operator[]
                              ((span<libtorrent::span<char>_> *)auStack_40,(long)local_a0);
        p_00[-1].m_len = 0x7cf588;
        psVar9 = span<libtorrent::span<char>_>::operator[]
                           ((span<libtorrent::span<char>_> *)&this_local,(long)local_a0);
        local_1b0 = psVar9;
        p_00[-1].m_len = 0x7cf59d;
        p = span<char>::data(psVar9);
        psVar9 = local_1a8;
        lVar12 = (long)bufs.m_len._4_4_;
        p_00[-1].m_len = 0x7cf5b0;
        span<char>::span(psVar9,p,lVar12);
        bufs.m_len._4_4_ = 0;
      }
      else {
        p_00[-1].m_len = 0x7cf5ec;
        local_1b8 = span<libtorrent::span<char>_>::operator[]
                              ((span<libtorrent::span<char>_> *)auStack_40,(long)local_a0);
        p_00[-1].m_len = 0x7cf605;
        psVar10 = span<libtorrent::span<char>_>::operator[]
                            ((span<libtorrent::span<char>_> *)&this_local,(long)local_a0);
        psVar9 = local_1b8;
        local_1c0 = psVar10;
        p_00[-1].m_len = 0x7cf621;
        span<char>::span<libtorrent::span<char>,char,void>(psVar9,psVar10);
        bufs.m_len._4_4_ = bufs.m_len._4_4_ - (int)iVar7;
      }
      local_a0 = local_a0 + 1;
    }
    p_00[-1].m_len = 0x7cf657;
    sVar13 = span<libtorrent::span<char>_>::first
                       ((span<libtorrent::span<char>_> *)auStack_40,(long)size);
    local_1d0 = (span<char> *)sVar13.m_len;
    local_1c8 = (encryption_handler *)sVar13.m_ptr;
    _auStack_40 = local_1c8;
    bufs.m_ptr = local_1d0;
    p_00[-1].m_len = 0x7cf6a5;
    alloca_destructor<libtorrent::span<char>_>::~alloca_destructor
              ((alloca_destructor<libtorrent::span<char>_> *)&i);
  }
  out_iovec.m_len._4_4_ = 0;
  *(undefined8 *)((long)p_00 + -8) = 0x7cf6cd;
  span<libtorrent::span<const_char>_>::span((span<libtorrent::span<const_char>_> *)local_e0);
  *(undefined8 *)((long)p_00 + -8) = 0x7cf6d6;
  bVar5 = span<libtorrent::span<char>_>::empty((span<libtorrent::span<char>_> *)auStack_40);
  plVar4 = local_148;
  if (!bVar5) {
    *(undefined8 *)((long)p_00 + -8) = 0x7cf6e6;
    pvVar6 = ::std::__cxx11::
             list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
             ::front(plVar4);
    *(undefined8 *)((long)p_00 + -8) = 0x7cf6ee;
    local_1d8 = ::std::
                __shared_ptr_access<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::crypto_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)pvVar6);
    *(undefined8 *)((long)p_00 + -8) = 0x7cf705;
    span<libtorrent::span<char>>::
    span<libtorrent::span<libtorrent::span<char>>,libtorrent::span<char>,void>
              ((span<libtorrent::span<char>> *)&local_108,
               (span<libtorrent::span<char>_> *)auStack_40);
    peVar3 = local_1d8;
    p_Var1 = local_1d8->_vptr_crypto_plugin[4];
    *(undefined8 *)((long)p_00 + -8) = 0x7cf727;
    (*p_Var1)(&local_f8,peVar3,local_108,local_100);
    *(undefined8 *)((long)p_00 + -8) = 0x7cf741;
    ::std::tie<int,libtorrent::span<libtorrent::span<char_const>>>
              ((int *)&__range3,(span<libtorrent::span<const_char>_> *)((long)&out_iovec.m_len + 4))
    ;
    *(undefined8 *)((long)p_00 + -8) = 0x7cf754;
    ::std::tuple<int&,libtorrent::span<libtorrent::span<char_const>>&>::operator=
              ((tuple<int&,libtorrent::span<libtorrent::span<char_const>>&> *)&__range3,&local_f8);
  }
  plVar4 = local_148;
  *(undefined8 *)((long)p_00 + -8) = 0x7cf760;
  pvVar6 = ::std::__cxx11::
           list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
           ::front(plVar4);
  plVar4 = local_148;
  if (pvVar6->next != 0x7fffffff) {
    if (bufs.m_len._4_4_ == 0) {
      *(undefined8 *)((long)p_00 + -8) = 0x7cf77b;
      sVar11 = ::std::__cxx11::
               list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
               ::size(plVar4);
      plVar4 = local_148;
      if (sVar11 == 1) {
        out_iovec.m_len._4_4_ = 0x7fffffff;
      }
      *(undefined8 *)((long)p_00 + -8) = 0x7cf797;
      ::std::__cxx11::
      list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
      ::pop_front(plVar4);
    }
    else {
      sStack_1e8.m_len._4_4_ = bufs.m_len._4_4_;
      *(undefined8 *)((long)p_00 + -8) = 0x7cf7ae;
      pvVar6 = ::std::__cxx11::
               list<libtorrent::aux::encryption_handler::barrier,_std::allocator<libtorrent::aux::encryption_handler::barrier>_>
               ::front(plVar4);
      pvVar6->next = sStack_1e8.m_len._4_4_;
    }
  }
  if ((abufs.m_len._7_1_ & 1) != 0) {
    *(undefined8 *)((long)p_00 + -8) = 0x7cf7d6;
    __end3 = span<libtorrent::span<char>_>::begin((span<libtorrent::span<char>_> *)auStack_40);
    *(undefined8 *)((long)p_00 + -8) = 0x7cf7e9;
    buf.m_len = (difference_type)
                span<libtorrent::span<char>_>::end((span<libtorrent::span<char>_> *)auStack_40);
    for (; __end3 != (span<char> *)buf.m_len; __end3 = __end3 + 1) {
      *(undefined8 *)((long)p_00 + -8) = 0x7cf813;
      span<char>::span<libtorrent::span<char>,char,void>((span<char> *)local_140,__end3);
    }
  }
  __return_storage_ptr__ = local_158;
  *(undefined8 *)((long)p_00 + -8) = 0x7cf843;
  ::std::make_tuple<int&,libtorrent::span<libtorrent::span<char_const>>&>
            ((tuple<int,_libtorrent::span<libtorrent::span<const_char>_>_> *)__return_storage_ptr__,
             (int *)((long)&out_iovec.m_len + 4),(span<libtorrent::span<const_char>_> *)local_e0);
  return;
}

Assistant:

std::tuple<int, span<span<char const>>>
	encryption_handler::encrypt(
		span<span<char>> iovec)
	{
		TORRENT_ASSERT(!m_send_barriers.empty());
		TORRENT_ASSERT(m_send_barriers.front().enc_handler);

		int to_process = m_send_barriers.front().next;

		span<span<char>> bufs;
		bool need_destruct = false;
		if (to_process != INT_MAX)
		{
			TORRENT_ALLOCA(abufs, span<char>, iovec.size());
			bufs = abufs;
			need_destruct = true;
			int num_bufs = 0;
			for (int i = 0; to_process > 0 && i < iovec.size(); ++i)
			{
				++num_bufs;
				int const size = int(iovec[i].size());
				if (to_process < size)
				{
					new (&bufs[i]) span<char>(
						iovec[i].data(), to_process);
					to_process = 0;
				}
				else
				{
					new (&bufs[i]) span<char>(iovec[i]);
					to_process -= size;
				}
			}
			bufs = bufs.first(num_bufs);
		}
		else
		{
			bufs = iovec;
		}

		int next_barrier = 0;
		span<span<char const>> out_iovec;
		if (!bufs.empty())
		{
			std::tie(next_barrier, out_iovec)
				= m_send_barriers.front().enc_handler->encrypt(bufs);
		}

		if (m_send_barriers.front().next != INT_MAX)
		{
			// to_process holds the difference between the size of the buffers
			// and the bytes left to the next barrier
			// if it's zero then pop the barrier
			// otherwise update the number of bytes remaining to the next barrier
			if (to_process == 0)
			{
				if (m_send_barriers.size() == 1)
				{
					// transitioning back to plaintext
					next_barrier = INT_MAX;
				}
				m_send_barriers.pop_front();
			}
			else
			{
				m_send_barriers.front().next = to_process;
			}
		}

#if TORRENT_USE_ASSERTS
		if (next_barrier != INT_MAX && next_barrier != 0)
		{
			int payload = 0;
			for (auto buf : bufs)
				payload += int(buf.size());

			int overhead = 0;
			for (auto buf : out_iovec)
				overhead += int(buf.size());
			TORRENT_ASSERT(overhead + payload == next_barrier);
		}
#endif
		if (need_destruct)
		{
			for (auto buf : bufs)
				buf.~span<char>();
		}
		return std::make_tuple(next_barrier, out_iovec);
	}